

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txvalidation_tests.cpp
# Opt level: O1

void __thiscall
txvalidation_tests::tx_mempool_reject_coinbase::test_method(tx_mempool_reject_coinbase *this)

{
  int *piVar1;
  uint uVar2;
  long lVar3;
  ChainstateManager *this_00;
  uint uVar4;
  readonly_property<bool> rVar5;
  int iVar6;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this_01;
  int *piVar7;
  unsigned_long uVar8;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar9;
  MempoolAcceptResult *pMVar10;
  iterator in_R8;
  iterator pvVar11;
  iterator in_R9;
  iterator pvVar12;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  check_type cVar13;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 local_2c8 [16];
  undefined1 *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  uint initialPoolSize;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  assertion_result local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f8;
  undefined1 local_1f0 [8];
  bool local_1e8 [8];
  pointer local_1e0;
  lazy_ostream *local_1d8;
  char **local_1d0;
  char *local_1c8;
  assertion_result local_1c0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  MempoolAcceptResult result;
  CMutableTransaction coinbaseTx;
  CScript scriptPubKey;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  coinbaseTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  coinbaseTx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  coinbaseTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  coinbaseTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  CKey::GetPubKey((CPubKey *)&result,&(this->super_TestChain100Setup).coinbaseKey);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1f0,(CPubKey *)&result);
  this_01 = &CScript::operator<<((CScript *)&coinbaseTx,
                                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1f0)
             ->super_CScriptBase;
  uVar2 = this_01->_size;
  uVar4 = uVar2 - 0x1d;
  if (uVar2 < 0x1d) {
    uVar4 = uVar2;
  }
  ppVar9 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
           (this_01->_union).indirect_contents.indirect;
  if (uVar2 < 0x1d) {
    ppVar9 = this_01;
  }
  local_218.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0xac;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (this_01,(uchar *)((long)&ppVar9->_union + (long)(int)uVar4),(uchar *)&local_218);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&scriptPubKey.super_CScriptBase,this_01);
  if (local_1f0 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1f0,(long)local_1e0 - (long)local_1f0);
  }
  if (0x1c < coinbaseTx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_) {
    free(coinbaseTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
         super__Vector_impl_data._M_start);
    coinbaseTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
  }
  CMutableTransaction::CMutableTransaction(&coinbaseTx);
  coinbaseTx.version = 1;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&coinbaseTx.vin,1);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&coinbaseTx.vout,1);
  result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)0x0;
  result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length = 0;
  result.m_result_type = VALID;
  result._4_4_ = 0;
  result.m_state.super_ValidationState<TxValidationResult>.m_mode = M_VALID;
  result.m_state.super_ValidationState<TxValidationResult>.m_result = TX_RESULT_UNSET;
  local_1f0[0] = '[';
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&result,(iterator)&result,local_1f0
            );
  pMVar10 = (MempoolAcceptResult *)result._0_8_;
  uVar2 = result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length.
          _4_4_ - 0x1d;
  if (result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length.
      _4_4_ < 0x1d) {
    pMVar10 = &result;
    uVar2 = result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.
            _M_string_length._4_4_;
  }
  local_1f0[0] = 0x87;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&result,
             (uchar *)((long)&pMVar10->m_result_type + (long)(int)uVar2),local_1f0);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((coinbaseTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&result);
  if (0x1c < result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.
             _M_string_length._4_4_) {
    free((void *)result._0_8_);
    result.m_result_type = VALID;
    result._4_4_ = 0;
  }
  (coinbaseTx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
   super__Vector_impl_data._M_start)->nValue = 1000000;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((coinbaseTx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             &scriptPubKey.super_CScriptBase);
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidation_tests.cpp"
  ;
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x25;
  file.m_begin = (iterator)&local_230;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_240,msg);
  _cVar13 = 0x6b7801;
  CTransaction::CTransaction((CTransaction *)&result,&coinbaseTx);
  if (result.m_state.super_ValidationState<TxValidationResult>._0_8_ - result._0_8_ == 0x68) {
    piVar1 = (int *)(result._0_8_ + 0x20);
    _cVar13 = 0x6b7826;
    piVar7 = (int *)std::
                    __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                              (result._0_8_,piVar1);
    rVar5.super_class_property<bool>.value =
         (class_property<bool>)(*piVar1 == -1 && piVar7 == piVar1);
  }
  else {
    rVar5.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_218.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar5.super_class_property<bool>.value;
  local_218.m_message.px = (element_type *)0x0;
  local_218.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2c8._0_8_ = "CTransaction(coinbaseTx).IsCoinBase()";
  local_2c8._8_8_ = "";
  local_1e8[0] = false;
  local_1f0 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
  local_1e0 = boost::unit_test::lazy_ostream::inst;
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidation_tests.cpp"
  ;
  local_248 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  local_1d8 = (lazy_ostream *)local_2c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_218,(lazy_ostream *)local_1f0,1,0,WARN,_cVar13,(size_t)&local_250,0x25);
  boost::detail::shared_count::~shared_count(&local_218.m_message.pn);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             &result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.
              _M_string_length);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)&result);
  criticalblock11.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock11.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock11.super_unique_lock);
  uVar8 = CTxMemPool::size((this->super_TestChain100Setup).super_TestingSetup.
                           super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
                           super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                           super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                           super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  initialPoolSize = (uint)uVar8;
  this_00 = (this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
            super_BasicTestingSetup.m_node.chainman._M_t.
            super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
            super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
            super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
  local_1f0 = (undefined1  [8])0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_1e8,(CTransaction **)local_1f0,
             (allocator<CTransaction> *)&local_218,&coinbaseTx);
  ChainstateManager::ProcessTransaction(&result,this_00,(CTransactionRef *)local_1f0,false);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_1e8._1_7_,local_1e8[0]) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(local_1e8._1_7_,local_1e8[0]));
  }
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidation_tests.cpp"
  ;
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar13 = 0x6b79aa;
  file_00.m_end = (iterator)0x2c;
  file_00.m_begin = (iterator)&local_268;
  msg_00.m_end = pvVar12;
  msg_00.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_278,
             msg_00);
  local_218.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(result.m_result_type == INVALID);
  local_218.m_message.px = (element_type *)0x0;
  local_218.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2c8._0_8_ = "result.m_result_type == MempoolAcceptResult::ResultType::INVALID";
  local_2c8._8_8_ = "";
  local_1e8[0] = false;
  local_1f0 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
  local_1e0 = boost::unit_test::lazy_ostream::inst;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidation_tests.cpp"
  ;
  local_280 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  local_1d8 = (lazy_ostream *)local_2c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_218,(lazy_ostream *)local_1f0,1,0,WARN,_cVar13,(size_t)&local_288,0x2c);
  boost::detail::shared_count::~shared_count(&local_218.m_message.pn);
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidation_tests.cpp"
  ;
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x2f;
  file_01.m_begin = (iterator)&local_298;
  msg_01.m_end = pvVar12;
  msg_01.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2a8,
             msg_01);
  local_2c8._8_8_ = local_2c8._8_8_ & 0xffffffffffffff00;
  local_2c8._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_2b8 = boost::unit_test::lazy_ostream::inst;
  local_2b0 = "";
  local_220 = (char *)CTxMemPool::size((this->super_TestChain100Setup).super_TestingSetup.
                                       super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                                       mempool._M_t.
                                       super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>
                                       .super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  local_1d0 = &local_220;
  local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&initialPoolSize;
  local_198._M_dataplus._M_p._0_1_ = local_220 == (char *)(ulong)initialPoolSize;
  local_198._M_string_length = 0;
  local_198.field_2._M_allocated_capacity = 0;
  local_1c0._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidation_tests.cpp"
  ;
  local_1c0.m_message.px = (element_type *)0xf94eb8;
  local_1d8 = (lazy_ostream *)&local_1d0;
  local_1e8[0] = false;
  local_1f0 = (undefined1  [8])&PTR__lazy_ostream_013d3cf0;
  local_1e0 = boost::unit_test::lazy_ostream::inst;
  local_200 = &local_1f8;
  local_218.m_message.px = (element_type *)((ulong)local_218.m_message.px & 0xffffffffffffff00);
  local_218._0_8_ = &PTR__lazy_ostream_013d3d30;
  local_218.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_198,(lazy_ostream *)local_2c8,1,2,REQUIRE,0xf91eb0,
             (size_t)&local_1c0,0x2f,(lazy_ostream *)local_1f0,"initialPoolSize",&local_218);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_198.field_2._M_allocated_capacity);
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidation_tests.cpp"
  ;
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar13 = 0x6b7bf6;
  file_02.m_end = (iterator)0x32;
  file_02.m_begin = (iterator)&local_2d8;
  msg_02.m_end = pvVar12;
  msg_02.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2e8,
             msg_02);
  local_218.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       (result.m_state.super_ValidationState<TxValidationResult>.m_mode == M_INVALID);
  local_218.m_message.px = (element_type *)0x0;
  local_218.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2c8._0_8_ = "result.m_state.IsInvalid()";
  local_2c8._8_8_ = "";
  local_1e8[0] = false;
  local_1f0 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
  local_1e0 = boost::unit_test::lazy_ostream::inst;
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidation_tests.cpp"
  ;
  local_2f0 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  local_1d8 = (lazy_ostream *)local_2c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_218,(lazy_ostream *)local_1f0,1,0,WARN,_cVar13,(size_t)&local_2f8,0x32);
  boost::detail::shared_count::~shared_count(&local_218.m_message.pn);
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidation_tests.cpp"
  ;
  local_300 = "";
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x33;
  file_03.m_begin = (iterator)&local_308;
  msg_03.m_end = pvVar12;
  msg_03.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_318,
             msg_03);
  local_2c8._8_8_ = local_2c8._8_8_ & 0xffffffffffffff00;
  local_2c8._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_2b8 = boost::unit_test::lazy_ostream::inst;
  local_2b0 = "";
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_198,
             result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus.
             _M_p,result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.
                  _M_dataplus._M_p +
                  result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.
                  _M_string_length);
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_198,"coinbase");
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar6 == 0);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d0 = (char **)0xf94e54;
  local_1c8 = "";
  local_1e8[0] = false;
  local_1f0 = (undefined1  [8])&PTR__lazy_ostream_013d3d70;
  local_1e0 = boost::unit_test::lazy_ostream::inst;
  local_1d8 = (lazy_ostream *)&local_1f8;
  local_220 = "coinbase";
  local_218.m_message.px = (element_type *)((ulong)local_218.m_message.px & 0xffffffffffffff00);
  local_218._0_8_ = &PTR__lazy_ostream_013d4470;
  local_218.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_220;
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x2;
  local_1f8 = &local_198;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,(lazy_ostream *)local_2c8,1,2,REQUIRE,0xf94f56,(size_t)&local_1d0,0x33,
             (lazy_ostream *)local_1f0,"\"coinbase\"",&local_218);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidation_tests.cpp"
  ;
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar13 = 0x6b7e8c;
  file_04.m_end = (iterator)0x34;
  file_04.m_begin = (iterator)&local_328;
  msg_04.m_end = pvVar12;
  msg_04.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_338,
             msg_04);
  local_218.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       (result.m_state.super_ValidationState<TxValidationResult>.m_result == TX_CONSENSUS);
  local_218.m_message.px = (element_type *)0x0;
  local_218.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2c8._0_8_ = "result.m_state.GetResult() == TxValidationResult::TX_CONSENSUS";
  local_2c8._8_8_ = "";
  local_1e8[0] = false;
  local_1f0 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
  local_1e0 = boost::unit_test::lazy_ostream::inst;
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidation_tests.cpp"
  ;
  local_340 = "";
  local_1d8 = (lazy_ostream *)local_2c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_218,(lazy_ostream *)local_1f0,1,0,WARN,_cVar13,(size_t)&local_348,0x34);
  boost::detail::shared_count::~shared_count(&local_218.m_message.pn);
  if ((result.m_wtxids_fee_calculations.
       super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
       ._M_engaged == true) &&
     (result.m_wtxids_fee_calculations.
      super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
      ._M_engaged = false,
     result.m_wtxids_fee_calculations.
     super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
     ._M_payload.
     super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
     .
     super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
     ._M_payload._M_value.
     super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
     ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(result.m_wtxids_fee_calculations.
                    super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                    ._M_payload._M_value.
                    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)result.m_wtxids_fee_calculations.
                          super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                          ._M_payload._M_value.
                          super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    result.m_wtxids_fee_calculations.
                    super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                    ._M_payload._0_8_);
  }
  std::__cxx11::
  _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::_M_clear(&result.m_replaced_transactions.
              super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result.m_state.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p
      != &result.m_state.super_ValidationState<TxValidationResult>.m_debug_message.field_2) {
    operator_delete(result.m_state.super_ValidationState<TxValidationResult>.m_debug_message.
                    _M_dataplus._M_p,
                    result.m_state.super_ValidationState<TxValidationResult>.m_debug_message.field_2
                    ._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p
      != &result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2) {
    operator_delete(result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.
                    _M_dataplus._M_p,
                    result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2
                    ._M_allocated_capacity + 1);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock11.super_unique_lock);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&coinbaseTx.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&coinbaseTx.vin);
  if (0x1c < scriptPubKey.super_CScriptBase._size) {
    free(scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
    scriptPubKey.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(tx_mempool_reject_coinbase, TestChain100Setup)
{
    CScript scriptPubKey = CScript() << ToByteVector(coinbaseKey.GetPubKey()) << OP_CHECKSIG;
    CMutableTransaction coinbaseTx;

    coinbaseTx.version = 1;
    coinbaseTx.vin.resize(1);
    coinbaseTx.vout.resize(1);
    coinbaseTx.vin[0].scriptSig = CScript() << OP_11 << OP_EQUAL;
    coinbaseTx.vout[0].nValue = 1 * CENT;
    coinbaseTx.vout[0].scriptPubKey = scriptPubKey;

    BOOST_CHECK(CTransaction(coinbaseTx).IsCoinBase());

    LOCK(cs_main);

    unsigned int initialPoolSize = m_node.mempool->size();
    const MempoolAcceptResult result = m_node.chainman->ProcessTransaction(MakeTransactionRef(coinbaseTx));

    BOOST_CHECK(result.m_result_type == MempoolAcceptResult::ResultType::INVALID);

    // Check that the transaction hasn't been added to mempool.
    BOOST_CHECK_EQUAL(m_node.mempool->size(), initialPoolSize);

    // Check that the validation state reflects the unsuccessful attempt.
    BOOST_CHECK(result.m_state.IsInvalid());
    BOOST_CHECK_EQUAL(result.m_state.GetRejectReason(), "coinbase");
    BOOST_CHECK(result.m_state.GetResult() == TxValidationResult::TX_CONSENSUS);
}